

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int is_undirected_automorphism(saucy *s)

{
  Abc_Ntk_t *pNtk1;
  int *piVar1;
  undefined8 *__ptr;
  int iVar2;
  Abc_Ntk_t *pMiter;
  int *__ptr_00;
  Abc_Ntk_t *pAVar3;
  sim_result *psVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  uint uVar7;
  char *__s;
  long lVar8;
  double dVar9;
  
  if (0 < s->ndiffs) {
    lVar8 = 0;
    do {
      iVar2 = check_mapping(s,s->adj,s->edg,s->unsupp[lVar8]);
      if (iVar2 == 0) {
        return 0;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < s->ndiffs);
  }
  pNtk1 = s->pNtk;
  piVar1 = s->pModel;
  pMiter = Abc_NtkMiter(pNtk1,s->pNtk_permuted,1,0,0,0);
  if (pMiter == (Abc_Ntk_t *)0x0) {
    __s = "Miter computation has failed.";
    goto LAB_002af67f;
  }
  iVar2 = Abc_NtkMiterIsConstant(pMiter);
  if (iVar2 == 0) {
    __ptr_00 = Abc_NtkVerifyGetCleanModel(pMiter,1);
    pMiter->pModel = __ptr_00;
    pVVar5 = pNtk1->vPis;
    pAVar3 = pMiter;
    if (pVVar5->nSize < 1) {
      iVar2 = 0;
      if (__ptr_00 == (int *)0x0) {
        Abc_NtkDelete(pMiter);
        goto LAB_002af4fd;
      }
    }
    else {
      iVar2 = 0;
      lVar8 = 0;
      do {
        piVar1[lVar8] = __ptr_00[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar5->nSize);
    }
LAB_002af4d9:
    free(__ptr_00);
    pAVar3->pModel = (int *)0x0;
  }
  else {
    if (iVar2 == 1) {
      Abc_NtkDelete(pMiter);
      return 1;
    }
    pAVar3 = Abc_NtkMulti(pMiter,0,100,1,0,0,0);
    Abc_NtkDelete(pMiter);
    if (pAVar3 == (Abc_Ntk_t *)0x0) {
      __s = "Renoding for CNF has failed.";
LAB_002af67f:
      puts(__s);
      exit(1);
    }
    iVar2 = Abc_NtkMiterSat(pAVar3,10000,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
    if (iVar2 == -1) {
      __s = "Networks are undecided (SAT solver timed out).";
      goto LAB_002af67f;
    }
    __ptr_00 = pAVar3->pModel;
    if (__ptr_00 != (int *)0x0) {
      pVVar5 = pNtk1->vPis;
      if (0 < pVVar5->nSize) {
        lVar8 = 0;
        do {
          piVar1[lVar8] = __ptr_00[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar5->nSize);
      }
      goto LAB_002af4d9;
    }
  }
  Abc_NtkDelete(pAVar3);
  if (iVar2 != 0) {
    return iVar2;
  }
LAB_002af4fd:
  psVar4 = analyzeConflict(s->pNtk,s->pModel,s->fPrintTree);
  add_conterexample(s,psVar4);
  psVar4 = analyzeConflict(s->pNtk_permuted,s->pModel,s->fPrintTree);
  add_conterexample(s,psVar4);
  dVar9 = s->activityInc * 1.1111111111111112;
  s->activityInc = dVar9;
  pVVar5 = s->satCounterExamples;
  uVar7 = pVVar5->nSize;
  if (0x31 < (int)uVar7) {
    dVar9 = dVar9 / (double)(int)uVar7;
    do {
      lVar8 = 0;
      uVar6 = (ulong)uVar7;
      uVar7 = 0;
      do {
        __ptr = (undefined8 *)pVVar5->pArray[lVar8];
        if (dVar9 < (double)__ptr[3] || dVar9 == (double)__ptr[3]) {
          if ((int)uVar7 < lVar8) {
            if (((int)uVar7 < 0) || ((uint)uVar6 <= uVar7)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            pVVar5->pArray[uVar7] = __ptr;
            uVar7 = uVar7 + 1;
          }
        }
        else {
          if ((void *)*__ptr != (void *)0x0) {
            free((void *)*__ptr);
            *__ptr = 0;
          }
          if ((void *)__ptr[1] != (void *)0x0) {
            free((void *)__ptr[1]);
          }
          free(__ptr);
        }
        lVar8 = lVar8 + 1;
        pVVar5 = s->satCounterExamples;
        uVar6 = (ulong)pVVar5->nSize;
      } while (lVar8 < (long)uVar6);
      if (pVVar5->nSize < (int)uVar7) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
      }
      pVVar5->nSize = uVar7;
      dVar9 = dVar9 + dVar9;
    } while (0x23 < (int)uVar7);
  }
  return 0;
}

Assistant:

static int
is_undirected_automorphism(struct saucy *s)
{
    int i, j, ret;  

    for (i = 0; i < s->ndiffs; ++i) {
        j = s->unsupp[i];
        if (!check_mapping(s, s->adj, s->edg, j)) return 0;
    }

    ret = Abc_NtkCecSat_saucy(s->pNtk, s->pNtk_permuted, s->pModel);
    
    if( BACKTRACK_BY_SAT && !ret ) {
        struct sim_result * cex;

        cex = analyzeConflict( s->pNtk, s->pModel, s->fPrintTree );
        add_conterexample(s, cex);

        cex = analyzeConflict( s->pNtk_permuted, s->pModel, s->fPrintTree );
        add_conterexample(s, cex);      
        
        s->activityInc *= (1 / CLAUSE_DECAY);
        if (Vec_PtrSize(s->satCounterExamples) >= MAX_LEARNTS)
            reduceDB(s);
    }

    return ret;
}